

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::dereference_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *expr_type,string *expr)

{
  string local_30;
  
  if (*(expr->_M_dataplus)._M_p == '&') {
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)expr);
  }
  else if ((this->backend).native_pointers == true) {
    local_30._M_dataplus._M_p._0_1_ = 0x2a;
    join<char,std::__cxx11::string_const&>
              (__return_storage_ptr__,(spirv_cross *)&local_30,(char *)expr,expr);
  }
  else if (((expr_type->storage == StorageClassPhysicalStorageBuffer) &&
           (*(int *)&(expr_type->super_IVariant).field_0xc != 0xf)) &&
          (expr_type->pointer_depth == 1)) {
    enclose_expression(&local_30,this,expr);
    join<std::__cxx11::string,char_const(&)[7]>
              (__return_storage_ptr__,(spirv_cross *)&local_30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".value",
               (char (*) [7])expr);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)expr);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::dereference_expression(const SPIRType &expr_type, const std::string &expr)
{
	// If this expression starts with an address-of operator ('&'), then
	// just return the part after the operator.
	// TODO: Strip parens if unnecessary?
	if (expr.front() == '&')
		return expr.substr(1);
	else if (backend.native_pointers)
		return join('*', expr);
	else if (expr_type.storage == StorageClassPhysicalStorageBufferEXT && expr_type.basetype != SPIRType::Struct &&
	         expr_type.pointer_depth == 1)
	{
		return join(enclose_expression(expr), ".value");
	}
	else
		return expr;
}